

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fold_expr.cpp
# Opt level: O1

int main(void)

{
  ostream *poVar1;
  char local_9;
  
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
  std::ostream::put('0');
  std::ostream::flush();
  UR_MULT<int,int,int,int>(9,3,4,5);
  UL_DIVIDE<int,int,int,int>(0x5a,2,9,1);
  BR_XOR<int,int,int>(0xc,3,5);
  BR_SOR<>();
  local_9 = '\n';
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,&local_9,1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return 0;
}

Assistant:

int main() {
	std::cout<<std::endl;

	//UNARY RIGHT FOLD
	UR_MULT(9,3,4,5);

	//UNARY LEFT FOLD
	UL_DIVIDE(90,2,9,1); //Note that this would have failed it had it been a right fold.

	//BINARY RIGHT FOLD
	BR_XOR(12,3,5);

	//BINARY LEFT FOLD
	BR_SOR(); //Empty pack is false by default so (false || true) = true

	std::cout << '\n' << std::endl;
	return 0;
}